

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::MILSpec::Dimension_ConstantDimension::ByteSizeLong
          (Dimension_ConstantDimension *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (this->size_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->size_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::uint64 Dimension_ConstantDimension::size() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.MILSpec.Dimension.ConstantDimension.size)
  return size_;
}